

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O3

void __thiscall
t_rb_generator::generate_rb_union
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct,bool is_exception)

{
  ostream *poVar1;
  int iVar2;
  t_rb_generator *ptVar3;
  string local_48;
  
  generate_rdoc(this,out,(t_doc *)tstruct);
  if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  ptVar3 = (t_rb_generator *)0x399c84;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"class ",6);
  type_name_abi_cxx11_(&local_48,ptVar3,&tstruct->super_t_type);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," < ::Thrift::Union",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  iVar2 = *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8;
  *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 =
       iVar2 + 1;
  if (-1 < iVar2) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"include ::Thrift::Struct_Union",0x1e);
  ptVar3 = (t_rb_generator *)out;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  generate_field_constructors(ptVar3,out,tstruct);
  generate_field_constants(ptVar3,out,tstruct);
  generate_field_defns(this,out,tstruct);
  generate_rb_union_validator(this,out,tstruct);
  if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"::Thrift::Union.generate_accessors self",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar2 = *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8;
  *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 =
       iVar2 + -1;
  if (1 < iVar2) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"end",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_rb_generator::generate_rb_union(t_rb_ofstream& out,
                                       t_struct* tstruct,
                                       bool is_exception = false) {
  (void)is_exception;
  generate_rdoc(out, tstruct);
  out.indent() << "class " << type_name(tstruct) << " < ::Thrift::Union" << endl;

  out.indent_up();
  out.indent() << "include ::Thrift::Struct_Union" << endl;

  generate_field_constructors(out, tstruct);

  generate_field_constants(out, tstruct);
  generate_field_defns(out, tstruct);
  generate_rb_union_validator(out, tstruct);

  out.indent() << "::Thrift::Union.generate_accessors self" << endl;

  out.indent_down();
  out.indent() << "end" << endl << endl;
}